

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

double __thiscall Json::Value::asDouble(Value *this)

{
  ValueType VVar1;
  Value *local_1d8;
  String local_1c0;
  ostringstream local_190 [8];
  OStringStream oss;
  Value *this_local;
  
  VVar1 = type(this);
  switch(VVar1) {
  case nullValue:
    this_local = (Value *)0x0;
    break;
  case intValue:
    this_local = (Value *)(double)(this->value_).int_;
    break;
  case uintValue:
    this_local = (Value *)integerToDouble((this->value_).uint_);
    break;
  case realValue:
    this_local = (Value *)(this->value_).map_;
    break;
  default:
    std::__cxx11::ostringstream::ostringstream(local_190);
    std::operator<<((ostream *)local_190,"Value is not convertible to double.");
    std::__cxx11::ostringstream::str();
    throwLogicError(&local_1c0);
  case booleanValue:
    local_1d8 = (Value *)0x3ff0000000000000;
    if (((this->value_).bool_ & 1U) == 0) {
      local_1d8 = (Value *)0x0;
    }
    this_local = local_1d8;
  }
  return (double)this_local;
}

Assistant:

double Value::asDouble() const {
  switch (type()) {
  case intValue:
    return static_cast<double>(value_.int_);
  case uintValue:
#if !defined(JSON_USE_INT64_DOUBLE_CONVERSION)
    return static_cast<double>(value_.uint_);
#else  // if !defined(JSON_USE_INT64_DOUBLE_CONVERSION)
    return integerToDouble(value_.uint_);
#endif // if !defined(JSON_USE_INT64_DOUBLE_CONVERSION)
  case realValue:
    return value_.real_;
  case nullValue:
    return 0.0;
  case booleanValue:
    return value_.bool_ ? 1.0 : 0.0;
  default:
    break;
  }
  JSON_FAIL_MESSAGE("Value is not convertible to double.");
}